

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

Option<Kernel::RationalConstantType> * __thiscall
Kernel::FuncId::tryNumeral<Kernel::NumTraits<Kernel::RationalConstantType>>
          (Option<Kernel::RationalConstantType> *__return_storage_ptr__,FuncId *this)

{
  bool bVar1;
  Numeral out;
  RationalConstantType RStack_38;
  
  RationalConstantType::RationalConstantType(&RStack_38);
  bVar1 = Theory::tryInterpretConstant((Theory *)theory,this->_num,&RStack_38);
  if (bVar1) {
    Lib::OptionBase<Kernel::RationalConstantType>::OptionBase
              (&__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>,&RStack_38);
  }
  else {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem +
     8) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem +
     0x10) = 0;
    *(undefined8 *)&__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType> = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem +
     0x18) = 0;
  }
  mpz_clear(RStack_38._den._val);
  mpz_clear((__mpz_struct *)&RStack_38);
  return __return_storage_ptr__;
}

Assistant:

Option<typename Number::ConstantType> FuncId::tryNumeral() const
{ 
  using Numeral = typename Number::ConstantType;
  Numeral out;
  if (theory->tryInterpretConstant(_num, out)) {
    return Option<Numeral>(out);
  } else {
    return Option<Numeral>();
  }
}